

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
InnerMap::~InnerMap(InnerMap *this)

{
  InnerMap *this_local;
  
  if (this->table_ != (void **)0x0) {
    clear(this);
    Map<std::__cxx11::string,double>::InnerMap::Dealloc<void*>
              ((InnerMap *)this,this->table_,this->num_buckets_);
  }
  return;
}

Assistant:

~InnerMap() {
      if (table_ != NULL) {
        clear();
        Dealloc<void*>(table_, num_buckets_);
      }
    }